

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
* __thiscall
embree::
DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
::operator=(DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
            *this,DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
                  *other)

{
  DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
  *pDVar1;
  size_t i;
  ulong uVar2;
  DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
  *pDVar3;
  Face *pFVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = 0;
  while( true ) {
    pDVar1 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
              *)other->data;
    uVar2 = 0x40;
    if (pDVar1 == other) {
      uVar2 = 0x10;
    }
    if (uVar2 <= uVar6) break;
    pDVar3 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
              *)this->data;
    if ((0xf < uVar6) && (pDVar3 == this)) {
      pFVar4 = (Face *)operator_new__(0x200);
      this->data = pFVar4;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        this->data[lVar5] = this->arr[lVar5];
      }
      pDVar3 = (DynamicStackArray<embree::GeneralCatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::Face,_16UL,_64UL>
                *)this->data;
    }
    pDVar3->arr[uVar6] = pDVar1->arr[uVar6];
    uVar6 = uVar6 + 1;
  }
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }